

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thstd.c
# Opt level: O2

void std_write(thstd_t *std,char *filename)

{
  void *pvVar1;
  char *pcVar2;
  FILE *__stream;
  FILE *__stream_00;
  int *piVar3;
  char *pcVar4;
  long lVar5;
  list_node_t *plVar6;
  ulong uVar7;
  undefined8 *puVar8;
  bool bVar9;
  uint32_t entry_offset;
  int32_t endcode;
  ulong local_38;
  
  __stream_00 = fopen(filename,"wb");
  __stream = _stderr;
  pcVar2 = argv0;
  if (__stream_00 == (FILE *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(__stream,"%s: couldn\'t open %s for writing: %s\n",pcVar2,filename,pcVar4);
  }
  uVar7 = (ulong)(option_version == 0) << 10 | 0x90;
  file_write((FILE *)__stream_00,(&std->header_06)[option_version != 0],uVar7);
  entry_offset = (int)uVar7 + (uint)std->header->nb_objects * 4;
  plVar6 = (list_node_t *)&std->entries;
  lVar5 = 0;
  local_38 = uVar7;
  while (plVar6 = plVar6->next, plVar6 != (list_node_t *)0x0) {
    puVar8 = (undefined8 *)plVar6->data;
    *(short *)*puVar8 = (short)lVar5;
    file_seek((FILE *)__stream_00,local_38 + lVar5 * 4);
    file_write((FILE *)__stream_00,&entry_offset,4);
    file_seek((FILE *)__stream_00,(ulong)entry_offset);
    file_write((FILE *)__stream_00,(void *)*puVar8,0x1c);
    puVar8 = puVar8 + 1;
    while (entry_offset = entry_offset + 0x1c, puVar8 = (undefined8 *)*puVar8,
          puVar8 != (undefined8 *)0x0) {
      pvVar1 = (void *)puVar8[2];
      *(undefined2 *)((long)pvVar1 + 2) = 0x1c;
      file_write((FILE *)__stream_00,pvVar1,0x1c);
    }
    endcode = 0x4ffff;
    file_write((FILE *)__stream_00,&endcode,4);
    entry_offset = entry_offset + 4;
    lVar5 = lVar5 + 1;
  }
  plVar6 = (list_node_t *)&std->instances;
  while (plVar6 = plVar6->next, plVar6 != (list_node_t *)0x0) {
    file_write((FILE *)__stream_00,plVar6->data,0x10);
  }
  endcode = -1;
  lVar5 = 4;
  while (bVar9 = lVar5 != 0, lVar5 = lVar5 + -1, bVar9) {
    file_write((FILE *)__stream_00,&endcode,4);
  }
  plVar6 = (list_node_t *)&std->instrs;
  while (plVar6 = plVar6->next, plVar6 != (list_node_t *)0x0) {
    pvVar1 = plVar6->data;
    if (option_version == 0) {
      *(undefined2 *)((long)pvVar1 + 6) = 0xc;
      uVar7 = 0x14;
    }
    else {
      uVar7 = (ulong)*(ushort *)((long)pvVar1 + 6);
    }
    file_write((FILE *)__stream_00,pvVar1,uVar7);
  }
  lVar5 = 5;
  while (bVar9 = lVar5 != 0, lVar5 = lVar5 + -1, bVar9) {
    file_write((FILE *)__stream_00,&endcode,4);
  }
  fclose(__stream_00);
  return;
}

Assistant:

static void
std_write(
          thstd_t* std,
          const char *filename)
{
    FILE *stream;
    size_t i;
    std_entry_t *entry;
    std_object_t *quad;
    std_object_instance_t *instance;
    std_instr_t *instr;
    uint32_t offset;
    uint32_t entry_offset;
    int32_t endcode;

    stream = fopen(filename, "wb");
    if (!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
                argv0, filename, strerror(errno));
    }

    if (option_version == 0) {
        file_write(stream, std->header_06, sizeof(std_header_06_t));
        offset = sizeof(std_header_06_t);
    } else {
        file_write(stream, std->header_10, sizeof(std_header_10_t));
        offset = sizeof(std_header_10_t);
    }


    entry_offset = (offset +
                    sizeof(int32_t) * (uint32_t)std->header->nb_objects);

    i = 0;
    list_for_each(&std->entries, entry) {
        entry->header->id = i;

        file_seek(stream, offset + i*sizeof(int32_t));
        file_write(stream, &entry_offset, sizeof(uint32_t));

        file_seek(stream, entry_offset);
        file_write(stream, entry->header, sizeof(std_entry_header_t));
        entry_offset += sizeof(std_entry_header_t);

        list_for_each(&entry->quads, quad) {
            quad->size = 0x1c;
            file_write(stream, quad, sizeof(std_object_t));
            entry_offset += sizeof(std_object_t);
        }

        endcode = 0x0004FFFF;
        file_write(stream, &endcode, sizeof(int32_t));
        entry_offset += sizeof(int32_t);

        i++;
    }

    list_for_each(&std->instances, instance) {
        file_write(stream, instance, sizeof(std_object_instance_t));
    }

    endcode = 0xFFFFFFFF;
    for(i = 0; i < 4; i++)
        file_write(stream, &endcode, sizeof(int32_t));

    list_for_each(&std->instrs, instr) {
        if (option_version == 0) {
            instr->size = 12;
            file_write(stream, instr, instr->size + sizeof(uint32_t) * 2);
        }
        else
            file_write(stream, instr, instr->size);
    }

    for(i = 0; i < 5; i++)
        file_write(stream, &endcode, sizeof(int32_t));

    fclose(stream);
}